

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dleq_impl.h
# Opt level: O0

int secp256k1_dleq_proof
              (secp256k1_ecmult_gen_context *ecmult_gen_ctx,secp256k1_scalar *s,secp256k1_scalar *e,
              uchar *algo16,secp256k1_scalar *sk,secp256k1_ge *gen2)

{
  int iVar1;
  undefined1 local_398 [8];
  secp256k1_scalar k;
  uchar buf32 [32];
  undefined1 local_350 [8];
  secp256k1_ge r2;
  secp256k1_ge r1;
  secp256k1_gej r2j;
  secp256k1_gej r1j;
  secp256k1_sha256 sha;
  secp256k1_ge p2;
  secp256k1_ge p1;
  uchar key32 [32];
  uchar nonce32 [32];
  secp256k1_ge *gen2_local;
  secp256k1_scalar *sk_local;
  uchar *algo16_local;
  secp256k1_scalar *e_local;
  secp256k1_scalar *s_local;
  secp256k1_ecmult_gen_context *ecmult_gen_ctx_local;
  
  secp256k1_dleq_pair(ecmult_gen_ctx,(secp256k1_ge *)&p2.infinity,(secp256k1_ge *)&sha.bytes,sk,gen2
                     );
  secp256k1_sha256_initialize((secp256k1_sha256 *)&r1j.infinity);
  secp256k1_dleq_hash_point((secp256k1_sha256 *)&r1j.infinity,gen2);
  secp256k1_dleq_hash_point((secp256k1_sha256 *)&r1j.infinity,(secp256k1_ge *)&p2.infinity);
  secp256k1_dleq_hash_point((secp256k1_sha256 *)&r1j.infinity,(secp256k1_ge *)&sha.bytes);
  secp256k1_sha256_finalize((secp256k1_sha256 *)&r1j.infinity,(uchar *)(k.d + 3));
  secp256k1_scalar_get_b32((uchar *)&p1.infinity,sk);
  iVar1 = nonce_function_dleq(key32 + 0x18,(uchar *)(k.d + 3),(uchar *)&p1.infinity,algo16);
  if (iVar1 == 0) {
    ecmult_gen_ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_scalar_set_b32((secp256k1_scalar *)local_398,key32 + 0x18,(int *)0x0);
    iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)local_398);
    if (iVar1 == 0) {
      secp256k1_ecmult_gen
                (ecmult_gen_ctx,(secp256k1_gej *)&r2j.infinity,(secp256k1_scalar *)local_398);
      secp256k1_ge_set_gej((secp256k1_ge *)&r2.infinity,(secp256k1_gej *)&r2j.infinity);
      secp256k1_ecmult_const((secp256k1_gej *)&r1.infinity,gen2,(secp256k1_scalar *)local_398,0x100)
      ;
      secp256k1_ge_set_gej((secp256k1_ge *)local_350,(secp256k1_gej *)&r1.infinity);
      secp256k1_dleq_challenge_hash
                (e,algo16,gen2,(secp256k1_ge *)&r2.infinity,(secp256k1_ge *)local_350,
                 (secp256k1_ge *)&p2.infinity,(secp256k1_ge *)&sha.bytes);
      secp256k1_scalar_mul(s,e,sk);
      secp256k1_scalar_add(s,s,(secp256k1_scalar *)local_398);
      secp256k1_scalar_clear((secp256k1_scalar *)local_398);
      ecmult_gen_ctx_local._4_4_ = 1;
    }
    else {
      ecmult_gen_ctx_local._4_4_ = 0;
    }
  }
  return ecmult_gen_ctx_local._4_4_;
}

Assistant:

static int secp256k1_dleq_proof(const secp256k1_ecmult_gen_context *ecmult_gen_ctx, secp256k1_scalar *s, secp256k1_scalar *e, const unsigned char *algo16, const secp256k1_scalar *sk, const secp256k1_ge *gen2) {
    unsigned char nonce32[32];
    unsigned char key32[32];
    secp256k1_ge p1, p2;
    secp256k1_sha256 sha;
    secp256k1_gej r1j, r2j;
    secp256k1_ge r1, r2;
    unsigned char buf32[32];
    secp256k1_scalar k;

    secp256k1_dleq_pair(ecmult_gen_ctx, &p1, &p2, sk, gen2);

    /* Everything that goes into the challenge hash must go into the nonce as well... */
    secp256k1_sha256_initialize(&sha);
    secp256k1_dleq_hash_point(&sha, gen2);
    secp256k1_dleq_hash_point(&sha, &p1);
    secp256k1_dleq_hash_point(&sha, &p2);
    secp256k1_sha256_finalize(&sha, buf32);
    secp256k1_scalar_get_b32(key32, sk);
    if (!nonce_function_dleq(nonce32, buf32, key32, algo16)) {
        return 0;
    }
    secp256k1_scalar_set_b32(&k, nonce32, NULL);
    if (secp256k1_scalar_is_zero(&k)) {
        return 0;
    }

    secp256k1_ecmult_gen(ecmult_gen_ctx, &r1j, &k);
    secp256k1_ge_set_gej(&r1, &r1j);
    secp256k1_ecmult_const(&r2j, gen2, &k, 256);
    secp256k1_ge_set_gej(&r2, &r2j);

    secp256k1_dleq_challenge_hash(e, algo16, gen2, &r1, &r2, &p1, &p2);
    secp256k1_scalar_mul(s, e, sk);
    secp256k1_scalar_add(s, s, &k);

    secp256k1_scalar_clear(&k);
    return 1;
}